

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool bssl::anon_unknown_0::DecodeBase64
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,char *in)

{
  uint8_t *out_00;
  size_t max_out;
  int iVar1;
  size_t sVar2;
  char *__ptr;
  size_t sStack_40;
  size_t len;
  
  sVar2 = strlen(in);
  iVar1 = EVP_DecodedLength(&len,sVar2);
  if (iVar1 == 0) {
    __ptr = "EVP_DecodedLength failed\n";
    sStack_40 = 0x19;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,len);
    max_out = len;
    out_00 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = strlen(in);
    iVar1 = EVP_DecodeBase64(out_00,&len,max_out,(uint8_t *)in,sVar2);
    if (iVar1 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,len);
      return true;
    }
    __ptr = "EVP_DecodeBase64 failed\n";
    sStack_40 = 0x18;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  return false;
}

Assistant:

static bool DecodeBase64(std::vector<uint8_t> *out, const char *in) {
  size_t len;
  if (!EVP_DecodedLength(&len, strlen(in))) {
    fprintf(stderr, "EVP_DecodedLength failed\n");
    return false;
  }

  out->resize(len);
  if (!EVP_DecodeBase64(out->data(), &len, len, (const uint8_t *)in,
                        strlen(in))) {
    fprintf(stderr, "EVP_DecodeBase64 failed\n");
    return false;
  }
  out->resize(len);
  return true;
}